

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffgtbc(fitsfile *fptr,LONGLONG *totalwidth,int *status)

{
  int iVar1;
  ushort **ppuVar2;
  char *local_a0;
  char *cptr;
  char message [81];
  tcolumn *colptr;
  LONGLONG nbytes;
  int ii;
  int tfields;
  int *status_local;
  LONGLONG *totalwidth_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    if (fptr->HDUposition == fptr->Fptr->curhdu) {
      if ((fptr->Fptr->datastart == -1) && (iVar1 = ffrdef(fptr,status), 0 < iVar1)) {
        return *status;
      }
    }
    else {
      ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
    }
    iVar1 = fptr->Fptr->tfield;
    unique0x00012000 = fptr->Fptr->tableptr;
    *totalwidth = 0;
    for (nbytes._0_4_ = 0; (int)nbytes < iVar1; nbytes._0_4_ = (int)nbytes + 1) {
      stack0xffffffffffffffc0->tbcol = *totalwidth;
      if (stack0xffffffffffffffc0->tdatatype == 0x10) {
        colptr = (tcolumn *)stack0xffffffffffffffc0->trepeat;
      }
      else if (stack0xffffffffffffffc0->tdatatype == 1) {
        colptr = (tcolumn *)((stack0xffffffffffffffc0->trepeat + 7) / 8);
      }
      else if (stack0xffffffffffffffc0->tdatatype < 1) {
        local_a0 = stack0xffffffffffffffc0->tform;
        while (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)*local_a0] & 0x800) != 0) {
          local_a0 = local_a0 + 1;
        }
        if (*local_a0 == 'P') {
          colptr = (tcolumn *)(stack0xffffffffffffffc0->trepeat << 3);
        }
        else {
          if (*local_a0 != 'Q') {
            snprintf((char *)&cptr,0x51,"unknown binary table column type: %s",
                     stack0xffffffffffffffc0->tform);
            ffpmsg((char *)&cptr);
            *status = 0x105;
            return *status;
          }
          colptr = (tcolumn *)(stack0xffffffffffffffc0->trepeat << 4);
        }
      }
      else {
        colptr = (tcolumn *)
                 (stack0xffffffffffffffc0->trepeat * (long)(stack0xffffffffffffffc0->tdatatype / 10)
                 );
      }
      *totalwidth = (LONGLONG)(colptr->ttype + *totalwidth);
      register0x00000000 = stack0xffffffffffffffc0 + 1;
    }
    fptr_local._4_4_ = *status;
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffgtbc(fitsfile *fptr,    /* I - FITS file pointer          */
           LONGLONG *totalwidth,  /* O - total width of a table row */
           int *status)       /* IO - error status              */
{
/*
  calculate the starting byte offset of each column of a binary table.
  Use the values of the datatype code and repeat counts in the
  column structure. Return the total length of a row, in bytes.
*/
    int tfields, ii;
    LONGLONG nbytes;
    tcolumn *colptr;
    char message[FLEN_ERRMSG], *cptr;

    if (*status > 0)
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               /* rescan header */
            return(*status);

    tfields = (fptr->Fptr)->tfield;
    colptr = (fptr->Fptr)->tableptr;  /* point to first column structure */

    *totalwidth = 0;

    for (ii = 0; ii < tfields; ii++, colptr++)
    {
        colptr->tbcol = *totalwidth;  /* byte offset in row to this column */

        if (colptr->tdatatype == TSTRING)
        {
            nbytes =  colptr->trepeat;   /* one byte per char */
        }
        else if (colptr->tdatatype == TBIT)
        {
            nbytes = ( colptr->trepeat + 7) / 8;
        }
        else if (colptr->tdatatype > 0)
        {
            nbytes =  colptr->trepeat * (colptr->tdatatype / 10);
        }
        else  {
	
	  cptr = colptr->tform;
	  while (isdigit(*cptr)) cptr++;
	
	  if (*cptr == 'P')  
	   /* this is a 'P' variable length descriptor (neg. tdatatype) */
            nbytes = colptr->trepeat * 8;
	  else if (*cptr == 'Q') 
	   /* this is a 'Q' variable length descriptor (neg. tdatatype) */
            nbytes = colptr->trepeat * 16;

	  else {
		snprintf(message,FLEN_ERRMSG,
		"unknown binary table column type: %s", colptr->tform);
		ffpmsg(message);
		*status = BAD_TFORM;
		return(*status);
	  }
 	}

       *totalwidth = *totalwidth + nbytes;
    }
    return(*status);
}